

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O2

size_t axl::sys::createSimpleTlsSlot(void)

{
  uint_t code;
  size_t sVar1;
  pthread_key_t key;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_20;
  
  code = pthread_key_create(&key,(__destr_function *)0x0);
  if (code == 0) {
    sVar1 = (size_t)key;
  }
  else {
    err::ErrorRef::ErrorRef((ErrorRef *)&local_20,code);
    err::setError((ErrorRef *)&local_20);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_20);
    sVar1 = 0xffffffffffffffff;
  }
  return sVar1;
}

Assistant:

size_t
createSimpleTlsSlot() {
	pthread_key_t key;
	int result = ::pthread_key_create(&key, NULL);
	if (result != 0) {
		err::setError(result);
		return -1;
	}

	ASSERT(sizeof(key) <= sizeof(size_t));
	return (size_t)key;
}